

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O2

void cmXMLParserEndElement(void *parser,char *name)

{
  allocator local_31;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,name,&local_31);
  (**(code **)(*parser + 0x48))(parser,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmXMLParserEndElement(void* parser, const char* name)
{
  // End element handler that is registered with the XML_Parser.  This
  // just casts the user data to a cmXMLParser and calls EndElement.
  static_cast<cmXMLParser*>(parser)->EndElement(name);
}